

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexTriangleFilter::buildKernel
          (PtexTriangleFilter *this,PtexTriangleKernel *k,float u,float v,float uw1,float vw1,
          float uw2,float vw2,float width,float blur,Res faceRes)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dd;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  
  fVar5 = width * 0.25 * width;
  fVar7 = (vw1 * vw1 + vw2 * vw2) * fVar5;
  fVar12 = (uw1 * vw1 + uw2 * vw2) * fVar5 * -2.0;
  fVar8 = fVar7 * 0.75;
  fVar9 = (fVar12 - fVar7) * 0.8660254;
  fVar7 = fVar7 * 0.25 + fVar12 * -0.5 + (uw1 * uw1 + uw2 * uw2) * fVar5;
  fVar5 = fVar9 * fVar9 + (fVar8 - fVar7) * (fVar8 - fVar7);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar12 = (fVar5 * 1.0089285 - (fVar8 + fVar7)) * 0.5;
  fVar11 = 0.5 / (float)(1 << (faceRes.ulog2 & 0x1fU));
  fVar11 = fVar11 * fVar11;
  if (fVar12 <= fVar11) {
    fVar12 = fVar11;
  }
  fVar11 = blur * 0.25 * blur;
  if (fVar11 <= fVar12) {
    fVar11 = fVar12;
  }
  fVar8 = fVar8 + fVar11;
  fVar11 = fVar11 + fVar7;
  fVar7 = fVar8 * fVar11 + fVar9 * -0.25 * fVar9;
  fVar5 = (fVar7 + fVar7) / (fVar8 + fVar11 + fVar5);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  iVar2 = 0x7f - ((uint)(fVar5 + fVar5) >> 0x17 & 0xff);
  iVar1 = 0;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  fVar8 = fVar8 * 1.3333334;
  fVar5 = fVar9 * 1.1547005 + fVar8;
  fVar7 = (fVar11 + fVar8 * -0.25 + fVar5 * 0.5) * 12.25;
  if (fVar7 < 0.0) {
    fVar9 = sqrtf(fVar7);
    uVar3 = extraout_XMM0_Dc;
    uVar4 = extraout_XMM0_Dd;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    fVar9 = SQRT(fVar7);
  }
  fVar8 = fVar8 * 12.25;
  fVar5 = fVar5 * 12.25;
  if (fVar8 < 0.0) {
    fVar12 = sqrtf(fVar8);
  }
  else {
    fVar12 = SQRT(fVar8);
  }
  fVar6 = (1.0 - u) - v;
  fVar11 = (fVar8 - fVar5) + fVar7;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  if (1.0 <= fVar11) {
    fVar11 = 1.0;
  }
  k->res = (Res)((ushort)(iVar1 << 8) | (ushort)iVar1 & 0xff);
  k->u = u;
  k->v = v;
  auVar10._4_4_ = fVar12;
  auVar10._0_4_ = fVar9;
  auVar10._8_4_ = uVar3;
  auVar10._12_4_ = uVar4;
  auVar10 = minps(auVar10,_DAT_00458ea0);
  k->u1 = u - auVar10._0_4_;
  k->v1 = v - auVar10._4_4_;
  k->w1 = fVar6 - fVar11;
  k->u2 = auVar10._0_4_ + u;
  k->v2 = auVar10._4_4_ + v;
  k->w2 = fVar11 + fVar6;
  k->A = fVar8;
  k->B = fVar5;
  k->C = fVar7;
  return;
}

Assistant:

void PtexTriangleFilter::buildKernel(PtexTriangleKernel& k, float u, float v,
                                     float uw1, float vw1, float uw2, float vw2,
                                     float width, float blur, Res faceRes)
{
    const float sqrt3 = 1.7320508075688772f;

    // compute ellipse coefficients, A*u^2 + B*u*v + C*v^2 == AC - B^2/4
    float scaleAC = 0.25f * width*width;
    float scaleB = -2.0f * scaleAC;
    float A = (vw1*vw1 + vw2*vw2) * scaleAC;
    float B = (uw1*vw1 + uw2*vw2) * scaleB;
    float C = (uw1*uw1 + uw2*uw2) * scaleAC;

    // convert to cartesian domain
    float Ac = 0.75f * A;
    float Bc = float(sqrt3/2) * (B-A);
    float Cc = 0.25f * A - 0.5f * B + C;

    // compute min blur for eccentricity clamping
    const float maxEcc = 15.0f; // max eccentricity
    const float eccRatio = (maxEcc*maxEcc + 1.0f) / (maxEcc*maxEcc - 1.0f);
    float X = sqrtf(squared(Ac - Cc) + squared(Bc));
    float b_e = 0.5f * (eccRatio * X - (Ac + Cc));

    // compute min blur for texel clamping
    // (ensure that ellipse is no smaller than a texel)
    float b_t = squared(0.5f / (float)faceRes.u());

    // add blur
    float b_b = 0.25f * blur * blur;
    float b = PtexUtils::max(b_b, PtexUtils::max(b_e, b_t));
    Ac += b;
    Cc += b;

    // compute minor radius
    float m = sqrtf(2.0f*(Ac*Cc - 0.25f*Bc*Bc) / (Ac + Cc + X));

    // choose desired resolution
    int reslog2 = PtexUtils::max(0, PtexUtils::calcResFromWidth(2.0f*m));

    // convert back to triangular domain
    A = float(4/3.0) * Ac;
    B = float(2/sqrt3) * Bc + A;
    C = -0.25f * A + 0.5f * B + Cc;

    // scale by kernel width
    float scale = PtexTriangleKernelWidth * PtexTriangleKernelWidth;
    A *= scale;
    B *= scale;
    C *= scale;

    // find u,v,w extents
    float uw = PtexUtils::min(sqrtf(C), 1.0f);
    float vw = PtexUtils::min(sqrtf(A), 1.0f);
    float ww = PtexUtils::min(sqrtf(A-B+C), 1.0f);

    // init kernel
    float w = 1.0f - u - v;
    k.set(Res((int8_t)reslog2, (int8_t)reslog2), u, v, u-uw, v-vw, w-ww, u+uw, v+vw, w+ww, A, B, C);
}